

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall
CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[155],char_data*&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
          *func,char (*args) [155],char_data **args_1)

{
  string_view fmt;
  string_view fmt_00;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  function<void_()> *in_R9;
  undefined8 *in_stack_00000008;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<const_char_(&)[155],_char_data_*&> tuple;
  value_type *in_stack_fffffffffffffdd8;
  tuple<const_char_(&)[155],_char_data_*&> *in_stack_fffffffffffffde0;
  queueEntry_t *this_00;
  char *in_stack_fffffffffffffde8;
  anon_class_176_3_3bdf3dc2 *__f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf0;
  long local_208;
  tuple<const_char_(&)[155],_char_data_*&> *in_stack_fffffffffffffe00;
  CQueue *in_stack_fffffffffffffe08;
  unsigned_long *in_stack_fffffffffffffe10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *args_2;
  CLogger *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_class_176_3_3bdf3dc2 aStack_1a8;
  int local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [56];
  queueEntry_t qStack_90;
  int local_c;
  
  qStack_90.function.super__Function_base._M_functor._M_unused._M_object = in_R9;
  local_c = in_ESI;
  if (in_ESI < 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    qStack_90.charList.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x2;
    fmt._M_str = (char *)in_RCX;
    fmt._M_len = in_stack_fffffffffffffe20;
    CLogger::Warn<unsigned_long>(in_stack_fffffffffffffe18,fmt,in_stack_fffffffffffffe10);
  }
  args_2 = &qStack_90.calleeFuncName.field_2;
  std::tuple<const_char_(&)[155],_char_data_*&>::tuple<true,_true>
            (in_stack_fffffffffffffde0,(char (*) [155])in_stack_fffffffffffffdd8,
             (char_data **)0x6fea25);
  GetCharacterData<char_const(&)[155],char_data*&>
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  local_f0 = local_c;
  args_00 = &local_e8;
  pbVar1 = in_RDI;
  std::__cxx11::string::string((string *)args_00,in_RDX);
  std::__cxx11::string::string(local_c8,in_RCX);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)in_RDX,
             (vector<char_data_*,_std::allocator<char_data_*>_> *)in_RCX);
  this_00 = &qStack_90;
  __f = &aStack_1a8;
  local_208 = 0;
  do {
    __f->args[local_208 + -8] =
         *(char *)((long)qStack_90.function.super__Function_base._M_functor._M_unused._0_8_ +
                  local_208);
    local_208 = local_208 + 1;
  } while (local_208 != 0x9b);
  aStack_1a8._160_8_ = *in_stack_00000008;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[155],char_data*&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(std::__cxx11::string,char_data*),char_const(&)[155],char_data*&)::_lambda()_1_,void>
            ((function<void_()> *)qStack_90.function.super__Function_base._M_functor._M_unused._0_8_
             ,__f);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::push_back
            ((vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_> *)this_00,
             in_stack_fffffffffffffdd8);
  queueEntry_t::~queueEntry_t(this_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             qStack_90.function.super__Function_base._M_functor._M_unused._0_8_,(char *)__f);
  fmt_00._M_str = (char *)pbVar1;
  fmt_00._M_len = (size_t)in_RDX;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)in_RCX,fmt_00,args_00,in_RDI,(int *)args_2->_M_local_buf);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::~vector
            ((vector<char_data_*,_std::allocator<char_data_*>_> *)
             qStack_90.function.super__Function_base._M_functor._M_unused._0_8_);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}